

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpCommsSS::setFlag(TcpCommsSS *this,string_view flag,bool val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view flag_00;
  byte bVar1;
  bool bVar2;
  byte in_CL;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  CommsInterface *in_stack_ffffffffffffff70;
  CommsInterface *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t sVar3;
  undefined1 val_00;
  NetworkCommsInterface *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *pcVar4;
  
  bVar1 = in_CL & 1;
  pcVar4 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  __x._M_str = in_stack_ffffffffffffffa0;
  __x._M_len = in_stack_ffffffffffffff98;
  __y._M_str = in_stack_ffffffffffffff90;
  __y._M_len = in_stack_ffffffffffffff88;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    bVar2 = CommsInterface::propertyLock(in_stack_ffffffffffffff78);
    if (bVar2) {
      *(byte *)(in_RDI + 0x4c1) = bVar1;
      CommsInterface::propertyUnLock(in_stack_ffffffffffffff70);
    }
  }
  else {
    sVar3 = in_RDX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    val_00 = (undefined1)(sVar3 >> 0x38);
    __x_00._M_str = in_stack_ffffffffffffffa0;
    __x_00._M_len = in_stack_ffffffffffffff98;
    __y_00._M_str = in_stack_ffffffffffffff90;
    __y_00._M_len = in_stack_ffffffffffffff88;
    bVar2 = std::operator==(__x_00,__y_00);
    if (bVar2) {
      bVar2 = CommsInterface::propertyLock(in_stack_ffffffffffffff78);
      if (bVar2) {
        *(byte *)(in_RDI + 0x4c0) = bVar1;
        CommsInterface::propertyUnLock(in_stack_ffffffffffffff70);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      __x_01._M_str = in_stack_ffffffffffffffa0;
      __x_01._M_len = in_RDX;
      __y_01._M_str = in_RSI;
      __y_01._M_len = in_stack_ffffffffffffff88;
      bVar2 = std::operator==(__x_01,__y_01);
      if (bVar2) {
        bVar2 = CommsInterface::propertyLock(in_stack_ffffffffffffff78);
        if (bVar2) {
          *(byte *)(in_RDI + 0x41c) = bVar1;
          CommsInterface::propertyUnLock(in_stack_ffffffffffffff70);
        }
      }
      else {
        flag_00._M_str = pcVar4;
        flag_00._M_len = in_stack_ffffffffffffffc8;
        NetworkCommsInterface::setFlag(in_stack_ffffffffffffffc0,flag_00,(bool)val_00);
      }
    }
  }
  return;
}

Assistant:

void TcpCommsSS::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "allow_outgoing") {
        if (propertyLock()) {
            outgoingConnectionsAllowed = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}